

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  FILE *in_RSI;
  long in_RDI;
  float *ptr;
  int len;
  bool is_array;
  int id;
  Allocator *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  int _w;
  
  clear(this);
  _w = 0;
  fread(&stack0xffffffffffffffec,4,1,in_RSI);
  while (_w != -0xe9) {
    if (_w < -0x5b03) {
      _w = -0x5b04 - _w;
      iVar1 = 0;
      fread(&stack0xffffffffffffffe4,4,1,in_RSI);
      Mat::create((Mat *)in_RSI,_w,CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd8 =
           (Allocator *)Mat::operator_cast_to_float_((Mat *)(in_RDI + (long)_w * 0x48 + 8));
      fread(in_stack_ffffffffffffffd8,4,(long)iVar1,in_RSI);
    }
    else {
      fread((void *)(in_RDI + (long)_w * 0x48 + 4),4,1,in_RSI);
    }
    *(undefined4 *)(in_RDI + (long)_w * 0x48) = 1;
    fread(&stack0xffffffffffffffec,4,1,in_RSI);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}